

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper_functions.h
# Opt level: O1

bool read_control_data(string *filename,vector<control_s,_std::allocator<control_s>_> *position_meas
                      )

{
  pointer *ppcVar1;
  uint uVar2;
  iterator __position;
  char cVar3;
  istream *piVar4;
  control_s meas;
  double yawrate;
  double velocity;
  string line_pos;
  istringstream iss_pos;
  ifstream in_file_pos;
  control_s local_3f8;
  double local_3e8;
  double local_3e0;
  undefined1 *local_3d8;
  undefined8 local_3d0;
  undefined1 local_3c8 [16];
  istringstream local_3b8 [120];
  ios_base local_340 [264];
  long local_238 [4];
  uint auStack_218 [122];
  
  std::ifstream::ifstream((istream *)local_238,(filename->_M_dataplus)._M_p,_S_in);
  uVar2 = *(uint *)((long)auStack_218 + *(long *)(local_238[0] + -0x18));
  if ((uVar2 & 5) == 0) {
    local_3d8 = local_3c8;
    local_3d0 = 0;
    local_3c8[0] = 0;
    while( true ) {
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_3d8,cVar3);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::istringstream::istringstream(local_3b8,(string *)&local_3d8,_S_in);
      std::istream::_M_extract<double>((double *)local_3b8);
      std::istream::_M_extract<double>((double *)local_3b8);
      local_3f8.velocity = local_3e0;
      local_3f8.yawrate = local_3e8;
      __position._M_current =
           (position_meas->super__Vector_base<control_s,_std::allocator<control_s>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (position_meas->super__Vector_base<control_s,_std::allocator<control_s>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<control_s,std::allocator<control_s>>::_M_realloc_insert<control_s_const&>
                  ((vector<control_s,std::allocator<control_s>> *)position_meas,__position,
                   &local_3f8);
      }
      else {
        (__position._M_current)->velocity = local_3e0;
        (__position._M_current)->yawrate = local_3e8;
        ppcVar1 = &(position_meas->super__Vector_base<control_s,_std::allocator<control_s>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
      }
      std::__cxx11::istringstream::~istringstream(local_3b8);
      std::ios_base::~ios_base(local_340);
    }
    if (local_3d8 != local_3c8) {
      operator_delete(local_3d8);
    }
  }
  std::ifstream::~ifstream(local_238);
  return (uVar2 & 5) == 0;
}

Assistant:

inline bool read_control_data(std::string filename, std::vector<control_s>& position_meas) {

	// Get file of position measurements:
	std::ifstream in_file_pos(filename.c_str(),std::ifstream::in);
	// Return if we can't open the file.
	if (!in_file_pos) {
		return false;
	}

	// Declare single line of position measurement file:
	std::string line_pos;

	// Run over each single line:
	while(getline(in_file_pos, line_pos)){

		std::istringstream iss_pos(line_pos);

		// Declare position values:
		double velocity, yawrate;

		// Declare single control measurement:
		control_s meas;

		//read data from line to values:

		iss_pos >> velocity;
		iss_pos >> yawrate;

		
		// Set values
		meas.velocity = velocity;
		meas.yawrate = yawrate;

		// Add to list of control measurements:
		position_meas.push_back(meas);
	}
	return true;
}